

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypedArray.cpp
# Opt level: O0

uint32 __thiscall
Js::TypedArrayBase::GetSourceLength
          (TypedArrayBase *this,RecyclableObject *arraySource,uint32 targetLength,uint32 offset)

{
  bool bVar1;
  Var aValue;
  uint local_30;
  uint32 local_2c;
  uint32 totalLength;
  uint32 sourceLength;
  ScriptContext *scriptContext;
  uint32 offset_local;
  uint32 targetLength_local;
  RecyclableObject *arraySource_local;
  TypedArrayBase *this_local;
  
  scriptContext._0_4_ = offset;
  scriptContext._4_4_ = targetLength;
  _offset_local = arraySource;
  arraySource_local = (RecyclableObject *)this;
  _totalLength = RecyclableObject::GetScriptContext((RecyclableObject *)this);
  aValue = Js::JavascriptOperators::OP_GetProperty(_offset_local,0xd1,_totalLength);
  local_2c = JavascriptConversion::ToUInt32(aValue,_totalLength);
  bVar1 = UInt32Math::Add((uint32)scriptContext,local_2c,&local_30);
  if ((!bVar1) && (local_30 <= scriptContext._4_4_)) {
    return local_2c;
  }
  JavascriptError::ThrowRangeError(_totalLength,-0x7ff5ec24,(PCWSTR)0x0);
}

Assistant:

uint32 TypedArrayBase::GetSourceLength(RecyclableObject* arraySource, uint32 targetLength, uint32 offset)
    {
        ScriptContext* scriptContext = GetScriptContext();
        uint32 sourceLength = JavascriptConversion::ToUInt32(JavascriptOperators::OP_GetProperty(arraySource, PropertyIds::length, scriptContext), scriptContext);
        uint32 totalLength;
        if (UInt32Math::Add(offset, sourceLength, &totalLength) ||
            (totalLength > targetLength))
        {
            JavascriptError::ThrowRangeError(
                scriptContext, JSERR_InvalidTypedArrayLength);
        }
        return sourceLength;
    }